

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O2

string * dumpstrings_abi_cxx11_
                   (string *__return_storage_ptr__,uint8_t *buf,size_t len,size_t *usedlen)

{
  byte bVar1;
  uint8_t uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  string escapecode;
  string escaped;
  uint local_9c;
  string local_98;
  size_t *local_78;
  string local_70 [32];
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_78 = usedlen;
  std::__cxx11::string::string<std::allocator<char>>(local_70,"\n\r\t",(allocator<char> *)&local_98)
  ;
  local_9c = 0;
  sVar7 = 0;
  bVar3 = false;
  do {
    do {
      sVar8 = len;
      if (len == sVar7) goto LAB_00127e9b;
      lVar6 = std::__cxx11::string::find((char)local_70,(ulong)(uint)(int)(char)buf[sVar7]);
      bVar1 = buf[sVar7];
      iVar4 = isprint((uint)bVar1);
      if ((lVar6 != -1 || (bVar1 == 0x5c || bVar1 == 0x22)) || (iVar4 != 0)) {
        if (!bVar3) {
          if (__return_storage_ptr__->_M_string_length != 0) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          bVar3 = true;
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        if (lVar6 != -1 || (bVar1 == 0x5c || bVar1 == 0x22)) {
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          local_98._M_string_length = 0;
          local_98.field_2._M_local_buf[0] = '\0';
          uVar2 = buf[sVar7];
          if ((((uVar2 == '\t') || (uVar2 == '\\')) || (uVar2 == '\r')) ||
             ((uVar2 == '\"' || (uVar2 == '\n')))) {
            std::__cxx11::string::assign((char *)&local_98);
          }
          else {
            stringformat_abi_cxx11_(&local_50,"\\x%02x");
            std::__cxx11::string::operator=((string *)&local_98,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
          }
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          goto LAB_00127e35;
        }
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      else {
        if (bVar3) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          bVar3 = false;
        }
        if (__return_storage_ptr__->_M_string_length != 0) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        stringformat_abi_cxx11_(&local_98,"%02x",(ulong)buf[sVar7]);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
LAB_00127e35:
        std::__cxx11::string::~string((string *)&local_98);
      }
      sVar7 = sVar7 + 1;
    } while (len <= sVar7);
    uVar5 = local_9c;
    if (sVar7 == 1) {
      if (*buf < 0xe) {
        uVar5 = 0x2401 >> (*buf & 0x1f);
      }
      else {
        uVar5 = 0;
      }
    }
  } while (((buf[sVar7] < 0xe) && (local_9c = 1, (0x2401U >> (buf[sVar7] & 0x1f) & 1) != 0)) ||
          (local_9c = 0, sVar8 = sVar7, (uVar5 & 1) == 0));
LAB_00127e9b:
  if (bVar3) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  *local_78 = sVar8;
  std::__cxx11::string::~string(local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string dumpstrings(const uint8_t *buf, size_t len, size_t &usedlen)
{
    std::string result;
    bool bQuoted= false;
    bool bThisIsEolChar= false;
    std::string escaped= "\n\r\t";

    size_t i;
    for (i=0 ; i<len ; i++)
    {
        bool bNeedsEscape= escaped.find((char)buf[i])!=escaped.npos 
            || buf[i]=='\"' 
            || buf[i]=='\\';

        if (isprint(buf[i]) || bNeedsEscape) {
            if (!bQuoted) {
                if (!result.empty())
                    result += ",";
                result += "\"";
                bQuoted= true;
            }
            if (bNeedsEscape) {
                std::string escapecode;
                switch(buf[i]) {
                    case '\n': escapecode= "\\n"; break;
                    case '\r': escapecode= "\\r"; break;
                    case '\t': escapecode= "\\t"; break;
                    case '\"': escapecode= "\\\""; break;
                    case '\\': escapecode= "\\\\"; break;
                    default:
                       escapecode= stringformat("\\x%02x", buf[i]);
                }
                result += escapecode;
            }
            else {
                result += (char) buf[i];
            }
        }
        else {
            if (bQuoted) {
                result += "\"";
                bQuoted= false;
            }
            if (!result.empty())
                result += ",";
            result += stringformat("%02x", buf[i]);
        }
        if (i+1<len) {
            if (i==0)
                bThisIsEolChar = (buf[i]==0x0a || buf[i]==0x0d || buf[i]==0);

            bool bNextIsEolChar= (buf[i+1]==0x0a || buf[i+1]==0x0d || buf[i+1]==0);
            if (bThisIsEolChar && !bNextIsEolChar) {
                i++;
                break;
            }
            bThisIsEolChar= bNextIsEolChar;
        }
    }

    if (bQuoted) {
        result += "\"";
        bQuoted= false;
    }

    usedlen= i;

    return result;
}